

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerimeterPointCoordinate.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::PerimeterPointCoordinate::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,PerimeterPointCoordinate *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  PerimeterPointCoordinate *local_18;
  PerimeterPointCoordinate *this_local;
  
  local_18 = this;
  this_local = (PerimeterPointCoordinate *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"X: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32X);
  poVar1 = std::operator<<(poVar1,",  Y: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Y);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString PerimeterPointCoordinate::GetAsString() const
{
    KStringStream ss;

    ss << "X: "    << m_f32X
       << ",  Y: " << m_f32Y
       << "\n";

    return ss.str();
}